

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

Float __thiscall pbrt::ParameterDictionary::UpgradeBlackbody(ParameterDictionary *this,string *name)

{
  double dVar1;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar2;
  size_t sVar3;
  char *pcVar4;
  size_t __n;
  int iVar5;
  long lVar6;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar7;
  float local_34;
  
  paVar2 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar3 = (this->params).nStored;
  paVar7 = &(this->params).field_2;
  if (paVar2 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar7 = paVar2;
  }
  if (sVar3 == 0) {
    local_34 = 1.0;
  }
  else {
    lVar6 = 0;
    local_34 = 1.0;
    do {
      pcVar4 = *(char **)((long)paVar7 + lVar6);
      __n = *(size_t *)(pcVar4 + 0x28);
      if ((__n == name->_M_string_length) &&
         (((__n == 0 ||
           (iVar5 = bcmp(*(void **)(pcVar4 + 0x20),(name->_M_dataplus)._M_p,__n), iVar5 == 0)) &&
          (iVar5 = std::__cxx11::string::compare(pcVar4), iVar5 == 0)))) {
        if (*(long *)(pcVar4 + 0x70) != 2) {
          ErrorExit((FileLoc *)(pcVar4 + 0x40),
                    "Expected two values for legacy \"blackbody\" parameter.");
        }
        dVar1 = *(double *)(*(long *)(pcVar4 + 0x60) + 8);
        pcVar4[0x70] = '\x01';
        pcVar4[0x71] = '\0';
        pcVar4[0x72] = '\0';
        pcVar4[0x73] = '\0';
        pcVar4[0x74] = '\0';
        pcVar4[0x75] = '\0';
        pcVar4[0x76] = '\0';
        pcVar4[0x77] = '\0';
        local_34 = (float)((double)local_34 * dVar1);
      }
      lVar6 = lVar6 + 8;
    } while (sVar3 << 3 != lVar6);
  }
  return local_34;
}

Assistant:

std::string ParameterDictionary::GetTexture(const std::string &name) const {
    for (const ParsedParameter *p : params) {
        if (p->name != name || p->type != "texture")
            continue;

        if (p->strings.empty())
            ErrorExit(&p->loc, "No string values provided for parameter \"%s\".", name);
        if (p->strings.size() > 1)
            ErrorExit(&p->loc, "More than one value provided for parameter \"%s\".",
                      name);
        p->lookedUp = true;
        return p->strings[0];
    }

    return "";
}